

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O3

bool duckdb::IsEnabledOptimizer
               (MetricsType metric,
               set<duckdb::OptimizerType,_std::less<duckdb::OptimizerType>,_std::allocator<duckdb::OptimizerType>_>
               *disabled_optimizers)

{
  _Rb_tree_color _Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  _Base_ptr p_Var4;
  bool bVar5;
  
  _Var1 = MetricsUtils::GetOptimizerTypeByMetric(metric);
  if (_Var1 != _S_red) {
    p_Var2 = (disabled_optimizers->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var2 == (_Base_ptr)0x0) {
      return true;
    }
    p_Var3 = &(disabled_optimizers->_M_t)._M_impl.super__Rb_tree_header;
    p_Var4 = &p_Var3->_M_header;
    do {
      bVar5 = p_Var2[1]._M_color < _Var1;
      if (!bVar5) {
        p_Var4 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[bVar5];
    } while (p_Var2 != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var4 == p_Var3) {
      return true;
    }
    if (_Var1 < p_Var4[1]._M_color) {
      return true;
    }
  }
  return false;
}

Assistant:

bool IsEnabledOptimizer(MetricsType metric, const set<OptimizerType> &disabled_optimizers) {
	auto matching_optimizer_type = MetricsUtils::GetOptimizerTypeByMetric(metric);
	if (matching_optimizer_type != OptimizerType::INVALID &&
	    disabled_optimizers.find(matching_optimizer_type) == disabled_optimizers.end()) {
		return true;
	}
	return false;
}